

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint64_t gt_virt_cnt_offset(CPUARMState_conflict *env)

{
  uint uVar1;
  uint64_t uVar2;
  
  if ((env->features & 0x200) == 0) {
    if (env->aarch64 != 0) {
      uVar1 = env->pstate >> 2 & 3;
      goto LAB_0061c238;
    }
    uVar1 = env->uncached_cpsr & 0x1f;
    if (uVar1 == 0x10) goto LAB_0061c278;
    if (uVar1 != 0x1a) goto LAB_0061c292;
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_0061c292;
    uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
LAB_0061c238:
    if (uVar1 == 0) {
LAB_0061c278:
      uVar2 = arm_hcr_el2_eff_aarch64(env);
      if ((~uVar2 & 0x408000000) == 0) {
        return 0;
      }
      goto LAB_0061c292;
    }
    if (uVar1 != 2) goto LAB_0061c292;
  }
  uVar2 = arm_hcr_el2_eff_aarch64(env);
  if ((uVar2 & 0x400000000) != 0) {
    return 0;
  }
LAB_0061c292:
  return (env->cp15).cntvoff_el2;
}

Assistant:

static uint64_t gt_virt_cnt_offset(CPUARMState *env)
{
    uint64_t hcr;

    switch (arm_current_el(env)) {
    case 2:
        hcr = arm_hcr_el2_eff(env);
        if (hcr & HCR_E2H) {
            return 0;
        }
        break;
    case 0:
        hcr = arm_hcr_el2_eff(env);
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            return 0;
        }
        break;
    }

    return env->cp15.cntvoff_el2;
}